

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

void __thiscall rengine::TestBase::onAfterRender(TestBase *this)

{
  Renderer *pRVar1;
  StaticRenderTest *pSVar2;
  int iVar3;
  ulong uVar4;
  uint *data;
  char *__s;
  size_t sVar5;
  uint y;
  uint x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  size_type *local_50;
  string file;
  undefined4 extraout_var;
  
  if (this->m_currentTest != (StaticRenderTest *)0x0) {
    (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[6])();
    fVar6 = extraout_XMM0_Da * extraout_XMM0_Db * 4.0;
    uVar4 = (ulong)fVar6;
    fVar7 = extraout_XMM0_Db;
    fVar8 = extraout_XMM0_Db;
    fVar9 = extraout_XMM0_Da;
    uVar10 = extraout_XMM0_Dc;
    data = (uint *)malloc((long)(fVar6 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4);
    x = (uint)fVar9;
    pRVar1 = (this->super_StandardSurface).m_renderer._M_t.
             super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
             super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
             super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
    y = (uint)fVar7;
    iVar3 = (*pRVar1->_vptr_Renderer[5])(pRVar1,0,0,(ulong)x,(ulong)y,data,fVar7,fVar8,fVar9,uVar10)
    ;
    if ((char)iVar3 == '\0') {
      __assert_fail("ok",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                    ,0xc6,"virtual void rengine::TestBase::onAfterRender()");
    }
    local_50 = &file._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pixeldump_","");
    (*this->m_currentTest->_vptr_StaticRenderTest[2])();
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    stbi_write_png((char *)local_50,x,y,4,data,(int)(fVar9 * 4.0));
    pSVar2 = this->m_currentTest;
    pSVar2->m_w = x;
    pSVar2->m_h = y;
    pSVar2->m_pixels = data;
    (*pSVar2->_vptr_StaticRenderTest[1])();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tst_",4);
    iVar3 = (*this->m_currentTest->_vptr_StaticRenderTest[2])();
    __s = (char *)CONCAT44(extraout_var,iVar3);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12f190);
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    if ((this->tests).
        super__List_base<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>.
        _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->tests) {
      if (this->leaveRunning == false) {
        Backend::m_singleton->m_running = false;
      }
    }
    else {
      (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[8])();
    }
    free(data);
    if (local_50 != &file._M_string_length) {
      operator_delete(local_50);
    }
  }
  return;
}

Assistant:

void onAfterRender() override {
        if (!m_currentTest)
            return;

        vec2 size = Surface::size();
        unsigned *pixels = (unsigned *) malloc(size.x * size.y * sizeof(unsigned));

        bool ok = renderer()->readPixels(0, 0, size.x, size.y, (unsigned *) pixels);
        check_true(ok);

        // dump the image to disk..
        string file("pixeldump_");
        file.append(m_currentTest->name());
        file.append(".png");
        stbi_write_png(file.c_str(), size.x, size.y, 4, pixels, size.x * sizeof(unsigned));

        m_currentTest->setPixels(size.x, size.y, pixels);
        m_currentTest->check();
        cout << "tst_" << m_currentTest->name() << ": ok" << endl;

        if (tests.empty()) {
            if (!leaveRunning)
                Backend::get()->quit();
        } else {
            requestRender();
        }

        free(pixels);
    }